

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::tree_node<int,_false>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<int,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_false>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  uint32_t *puVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar2;
  byte bVar3;
  internal_node<int,_false> *piVar4;
  rrb_size_table<false> *prVar5;
  rrb_size_table<false> *prVar6;
  leaf_node<int,_false> *plVar7;
  uint uVar8;
  int iVar9;
  ulong uVar11;
  uint32_t uVar12;
  long lVar13;
  ref<immutable::rrb_details::internal_node<int,_false>_> sliced_root;
  ref<immutable::rrb_details::tree_node<int,_false>_> right_hand_node;
  ref<immutable::rrb_details::internal_node<int,_false>_> internal_root;
  ref<immutable::rrb_details::tree_node<int,_false>_> internal_root_child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ulong uVar10;
  
  bVar3 = (byte)shift & 0x1f;
  uVar8 = right >> bVar3;
  if (shift == 0) {
    internal_root.ptr = (internal_node<int,_false> *)root->ptr;
    if (internal_root.ptr != (internal_node<int,_false> *)0x0) {
      (internal_root.ptr)->_ref_count = (internal_root.ptr)->_ref_count + 1;
    }
    internal_root_child.ptr = (tree_node<int,_false> *)leaf_node_create<int,false>(uVar8 + 1);
    if ((leaf_node<int,_false> *)internal_root_child.ptr != (leaf_node<int,_false> *)0x0) {
      ((leaf_node<int,_false> *)internal_root_child.ptr)->_ref_count = 1;
    }
    for (uVar11 = 0; uVar8 + 1 != uVar11; uVar11 = uVar11 + 1) {
      plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&internal_root);
      iVar9 = plVar7->child[uVar11];
      plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                          &internal_root_child);
      plVar7->child[uVar11] = iVar9;
    }
    *total_shift = 0;
    *(tree_node<int,_false> **)this = internal_root_child.ptr;
    if (internal_root_child.ptr != (tree_node<int,_false> *)0x0) {
      (internal_root_child.ptr)->_ref_count = (internal_root_child.ptr)->_ref_count + 1;
    }
    release<int>((leaf_node<int,_false> *)internal_root_child.ptr);
    release<int>((leaf_node<int,_false> *)internal_root.ptr);
    return (ref<immutable::rrb_details::tree_node<int,_false>_>)(tree_node<int,_false> *)this;
  }
  internal_root.ptr = (internal_node<int,_false> *)root->ptr;
  if (internal_root.ptr != (internal_node<int,_false> *)0x0) {
    (internal_root.ptr)->_ref_count = (internal_root.ptr)->_ref_count + 1;
  }
  piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root);
  if ((piVar4->size_table).ptr == (rrb_size_table<false> *)0x0) {
    piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root);
    uVar11 = (ulong)uVar8;
    internal_root_child.ptr = (tree_node<int,_false> *)piVar4->child[uVar11].ptr;
    if ((internal_node<int,_false> *)internal_root_child.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)internal_root_child.ptr)->_ref_count =
           ((internal_node<int,_false> *)internal_root_child.ptr)->_ref_count + 1;
    }
    rrb_drop_right_rec<int,false,6>
              ((rrb_details *)&right_hand_node,total_shift,&internal_root_child,
               right - (uVar8 << ((byte)shift & 0x1f)),shift - 6,right >> bVar3 != 0 || has_left);
    if (right >> bVar3 == 0) {
      if (!has_left) goto LAB_00147973;
      sliced_root.ptr = internal_node_create<int,false>(1);
      if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar4->child,
                 &right_hand_node);
    }
    else {
      sliced_root.ptr = internal_node_create<int,false>(uVar8 + 1);
      if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      for (lVar13 = 0; uVar11 * 8 != lVar13; lVar13 = lVar13 + 8) {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root)
        ;
        prVar2 = piVar4->child;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar4->child->ptr + lVar13),
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&prVar2->ptr + lVar13));
      }
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar4->child + uVar11),
                 &right_hand_node);
    }
    *total_shift = shift;
    *(internal_node<int,_false> **)this = sliced_root.ptr;
    if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
      (sliced_root.ptr)->_ref_count = (sliced_root.ptr)->_ref_count + 1;
    }
  }
  else {
    piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root);
    prVar6 = (piVar4->size_table).ptr;
    puVar1 = prVar6->size;
    uVar11 = (ulong)(uVar8 - 1);
    do {
      uVar10 = uVar11;
      iVar9 = (int)uVar10;
      uVar8 = iVar9 + 1;
      uVar11 = (ulong)uVar8;
    } while (puVar1[uVar11] <= right);
    uVar12 = right;
    if (uVar8 != 0) {
      uVar12 = right - puVar1[uVar10];
    }
    piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root);
    internal_root_child.ptr = (tree_node<int,_false> *)piVar4->child[uVar11].ptr;
    if ((internal_node<int,_false> *)internal_root_child.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)internal_root_child.ptr)->_ref_count =
           ((internal_node<int,_false> *)internal_root_child.ptr)->_ref_count + 1;
    }
    rrb_drop_right_rec<int,false,6>
              ((rrb_details *)&right_hand_node,total_shift,&internal_root_child,uVar12,shift - 6,
               uVar8 != 0 || has_left);
    if (uVar8 == 0) {
      if (!has_left) {
LAB_00147973:
        *(tree_node<int,_false> **)this = right_hand_node.ptr;
        if (right_hand_node.ptr != (tree_node<int,_false> *)0x0) {
          (right_hand_node.ptr)->_ref_count = (right_hand_node.ptr)->_ref_count + 1;
        }
        goto LAB_00147943;
      }
      sliced_root.ptr = internal_node_create<int,false>(1);
      if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      sliced_table.ptr = size_table_create<false>(1);
      if (sliced_table.ptr != (rrb_size_table<false> *)0x0) {
        (sliced_table.ptr)->_ref_count = 1;
      }
      prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      *prVar6->size = right + 1;
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar4->size_table,&sliced_table);
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar4->child,
                 &right_hand_node);
      *total_shift = shift;
    }
    else {
      uVar12 = iVar9 + 2;
      sliced_root.ptr = internal_node_create<int,false>(uVar12);
      if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      sliced_table.ptr = size_table_create<false>(uVar12);
      if (sliced_table.ptr != (rrb_size_table<false> *)0x0) {
        (sliced_table.ptr)->_ref_count = 1;
      }
      prVar5 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      memcpy(prVar5->size,prVar6->size,uVar11 * 4);
      prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      prVar6->size[uVar11] = right + 1;
      for (lVar13 = 0; uVar11 << 3 != lVar13; lVar13 = lVar13 + 8) {
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&internal_root)
        ;
        prVar2 = piVar4->child;
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar4->child->ptr + lVar13),
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&prVar2->ptr + lVar13));
      }
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar4->size_table,&sliced_table);
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar4->child + uVar11),
                 &right_hand_node);
      *total_shift = shift;
    }
    *(internal_node<int,_false> **)this = sliced_root.ptr;
    if (sliced_root.ptr != (internal_node<int,_false> *)0x0) {
      (sliced_root.ptr)->_ref_count = (sliced_root.ptr)->_ref_count + 1;
    }
    release(sliced_table.ptr);
  }
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&sliced_root);
LAB_00147943:
  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&right_hand_node);
  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&internal_root_child);
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&internal_root);
  return (ref<immutable::rrb_details::tree_node<int,_false>_>)(tree_node<int,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }